

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O3

int wally_wif_is_uncompressed(char *wif,size_t *written)

{
  int iVar1;
  undefined7 in_register_00000009;
  uchar buf [38];
  uchar auStack_38 [40];
  
  iVar1 = -2;
  if (written != (size_t *)0x0 && wif != (char *)0x0) {
    iVar1 = is_uncompressed(wif,auStack_38,(size_t)written,
                            (size_t *)
                            CONCAT71(in_register_00000009,
                                     written == (size_t *)0x0 || wif == (char *)0x0));
    wally_clear(auStack_38,0x26);
  }
  return iVar1;
}

Assistant:

int wally_wif_is_uncompressed(const char *wif,
                              size_t *written)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];

    if (!wif || !written)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), written);

    wally_clear(buf, sizeof(buf));
    return ret;
}